

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

int cJSON_GetArraySize(cJSON *array)

{
  int local_1c;
  cJSON *pcStack_18;
  int i;
  cJSON *c;
  cJSON *array_local;
  
  pcStack_18 = array->child;
  local_1c = 0;
  for (; pcStack_18 != (cJSON *)0x0; pcStack_18 = pcStack_18->next) {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int
cJSON_GetArraySize(cJSON *array)
{
    cJSON *c = array->child;
    int i = 0;
    while (c)
        i++, c = c->next;
    return i;
}